

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

pair<const_llvm::Value_*,_bool>
dg::vr::getCompared(ValueRelations *graph,ICmpInst *icmp,Value *from)

{
  V val;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var1;
  V pVVar2;
  long lVar3;
  ulong uVar4;
  pair<const_llvm::Value_*,_bool> pVar5;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_68;
  V local_50;
  V local_48 [3];
  
  local_50 = *(V *)(icmp + -0x40);
  pVVar2 = *(V *)(icmp + -0x20);
  local_48[0] = local_50;
  local_48[1] = pVVar2;
  lVar3 = 0;
  local_48[2] = from;
  do {
    val = *(V *)((long)local_48 + lVar3);
    RelationsAnalyzer::getFroms(&local_68,graph,val);
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                      (local_68.
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_68.
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_48 + 2);
    if (_Var1._M_current !=
        local_68.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (val != local_50) {
        pVVar2 = local_50;
      }
      uVar4 = CONCAT71((int7)((ulong)graph >> 8),
                       (ulong)((long)local_68.
                                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_68.
                                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) < 9);
      if (local_68.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0011fa17;
    }
    if (local_68.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x10);
  pVVar2 = (V)0x0;
  uVar4 = 0;
LAB_0011fa17:
  pVar5._8_8_ = uVar4 & 0xffffffff;
  pVar5.first = pVVar2;
  return pVar5;
}

Assistant:

std::pair<V, bool> getCompared(const ValueRelations &graph,
                               const llvm::ICmpInst *icmp,
                               const llvm::Value *from) {
    const auto *op1 = icmp->getOperand(0);
    const auto *op2 = icmp->getOperand(1);

    for (const auto *op : {op1, op2}) {
        const auto &froms = RelationsAnalyzer::getFroms(graph, op);
        if (std::find(froms.begin(), froms.end(), from) != froms.end()) {
            if (op == op1)
                return {op2, froms.size() <= 1};
            return {op1, froms.size() <= 1};
        }
    }
    return {nullptr, false};
}